

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O3

qint64 __thiscall QFileDevice::writeData(QFileDevice *this,char *data,qint64 len)

{
  QFileDevicePrivate *this_00;
  QRingBuffer *pQVar1;
  _Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_> _Var2;
  bool bVar3;
  FileError FVar4;
  qint64 qVar5;
  long lVar6;
  QFileDevicePrivate *d;
  FileError FVar7;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFileDevicePrivate *)(this->super_QIODevice).super_QObject.d_ptr.d;
  QFileDevicePrivate::setError(this_00,NoError);
  this_00->lastWasWrite = true;
  if (((this_00->super_QIODevicePrivate).openMode.
       super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
       super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 0x20) == 0) {
    pQVar1 = (this_00->super_QIODevicePrivate).writeBuffer.m_buf;
    if (pQVar1 == (QRingBuffer *)0x0) {
      qVar5 = 0;
    }
    else {
      qVar5 = pQVar1->bufferSize;
    }
    lVar6 = (long)(this_00->super_QIODevicePrivate).writeBufferChunkSize;
    if (lVar6 < qVar5 + len) {
      bVar3 = flush(this);
      lVar6 = -1;
      if (!bVar3) goto LAB_0023786f;
      lVar6 = (long)(this_00->super_QIODevicePrivate).writeBufferChunkSize;
    }
    if (len <= lVar6) {
      QRingBuffer::append((this_00->super_QIODevicePrivate).writeBuffer.m_buf,data,len);
      lVar6 = len;
      goto LAB_0023786f;
    }
  }
  _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
       (this_00->fileEngine)._M_t.
       super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
       super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
       super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
  lVar6 = (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                _M_head_impl + 0x128))
                    (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,data,len
                    );
  if (lVar6 < 0) {
    FVar4 = QAbstractFileEngine::error
                      ((QAbstractFileEngine *)
                       (this_00->fileEngine)._M_t.
                       super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                       .super__Head_base<0UL,_QAbstractFileEngine_*,_false>);
    FVar7 = WriteError;
    if (FVar4 != UnspecifiedError) {
      FVar7 = FVar4;
    }
    QAbstractFileEngine::errorString
              (&local_48,
               (QAbstractFileEngine *)
               (this_00->fileEngine)._M_t.
               super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
               ._M_t.
               super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
               .super__Head_base<0UL,_QAbstractFileEngine_*,_false>);
    this_00->error = FVar7;
    QString::operator=(&(this_00->super_QIODevicePrivate).errorString,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
LAB_0023786f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return lVar6;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QFileDevice::writeData(const char *data, qint64 len)
{
    Q_D(QFileDevice);
    unsetError();
    d->lastWasWrite = true;
    bool buffered = !(d->openMode & Unbuffered);

    // Flush buffered data if this read will overflow.
    if (buffered && (d->writeBuffer.size() + len) > d->writeBufferChunkSize) {
        if (!flush())
            return -1;
    }

    // Write directly to the engine if the block size is larger than
    // the write buffer size.
    if (!buffered || len > d->writeBufferChunkSize) {
        const qint64 ret = d->fileEngine->write(data, len);
        if (ret < 0) {
            QFileDevice::FileError err = d->fileEngine->error();
            if (err == QFileDevice::UnspecifiedError)
                err = QFileDevice::WriteError;
            d->setError(err, d->fileEngine->errorString());
        }
        return ret;
    }

    // Write to the buffer.
    d->writeBuffer.append(data, len);
    return len;
}